

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::emit_sample_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  uint uVar1;
  Op OVar2;
  uint count;
  char cVar3;
  bool bVar4;
  ComponentType element_type;
  Id IVar5;
  Id IVar6;
  Op OVar7;
  Dim DVar8;
  Op OVar9;
  Id IVar10;
  Value *pVVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  Builder *pBVar14;
  Operation *pOVar15;
  Operation *pOVar16;
  Operation *pOVar17;
  Type *pTVar18;
  byte bVar19;
  uint uVar20;
  uint32_t *num_dimensions;
  undefined4 uVar21;
  undefined8 unaff_RBX;
  char cVar22;
  undefined4 in_register_0000003c;
  uint uVar23;
  uint32_t uVar24;
  Op op;
  ulong uVar25;
  uint i;
  uint index;
  ulong uVar26;
  bool bVar27;
  undefined1 in_stack_fffffffffffffee8;
  uint32_t image_ops;
  undefined8 local_100;
  Id local_f4;
  Id local_f0;
  undefined4 local_ec;
  mapped_type *local_e8;
  Op local_dc;
  Builder *local_d8;
  uint local_d0;
  ComponentType tmp;
  Id local_c8;
  uint local_c4;
  Operation *local_c0;
  Operation *local_b8;
  Id local_b0;
  Id local_ac;
  Id local_a8;
  uint num_coords;
  uint num_coords_full;
  Id image_id;
  Id coord [4];
  Id loaded_id;
  Id local_68;
  Id IStack_64;
  Id IStack_60;
  Id IStack_5c;
  Id offsets [3];
  initializer_list<unsigned_int> local_48;
  undefined8 local_38;
  
  local_100._0_4_ = opcode;
  local_100._4_4_ = in_register_0000003c;
  if (((opcode - SampleCmp < 2) || (opcode == SampleCmpBias)) || (opcode == SampleCmpLevel)) {
    cVar22 = (impl->execution_mode_meta).synthesize_dummy_derivatives;
    uVar21 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  }
  else {
    cVar22 = (impl->execution_mode_meta).synthesize_dummy_derivatives;
    bVar4 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
    if (!bVar4) {
      return true;
    }
    uVar21 = 0;
  }
  local_d8 = Converter::Impl::builder(impl);
  pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
  image_id = IVar5;
  pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar6 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
  local_ec = uVar21;
  IVar5 = Converter::Impl::build_sampled_image(impl,IVar5,IVar6,SUB41(uVar21,0));
  pmVar12 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->handle_to_resource_meta,&image_id);
  num_coords_full = 0;
  num_dimensions = &num_coords;
  num_coords = 0;
  bVar4 = get_image_dimensions(impl,image_id,&num_coords_full,num_dimensions);
  count = num_coords_full;
  if (!bVar4) {
    return false;
  }
  coord[0] = 0;
  coord[1] = 0;
  coord[2] = 0;
  coord[3] = 0;
  uVar25 = (ulong)num_coords_full;
  local_a8 = IVar5;
  for (uVar26 = 0; OVar2 = (Op)local_100, uVar25 != uVar26; uVar26 = uVar26 + 1) {
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar26 + 3);
    IVar5 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
    coord[uVar26] = IVar5;
  }
  image_ops = 0;
  cVar3 = cVar22;
  local_e8 = pmVar12;
  if (cVar22 == '\0') {
LAB_0015eadc:
    cVar22 = cVar3;
    bVar4 = (Op)local_100 == Sample;
    bVar27 = (Op)local_100 == SampleCmpBias;
    if ((((Op)local_100 - Sample < 5) && ((0x13U >> ((Op)local_100 - Sample & 0x1f) & 1) != 0)) ||
       ((Op)local_100 == SampleCmpBias)) {
      emit_expect_assume_quad_uniform(impl);
    }
    local_d0 = (uint)CONCAT71((int7)((ulong)num_dimensions >> 8),OVar2 == SampleLevel);
    local_100._0_4_ = OVar2;
    if (OVar2 == SampleBias) {
LAB_0015ebc8:
      image_ops = 1;
    }
    else {
      OVar7 = OVar2;
      if ((OVar2 == SampleLevel) || (OVar2 == SampleCmpLevelZero)) goto LAB_0015ebb5;
      if (OVar2 == SampleCmpBias) goto LAB_0015ebc8;
      if (OVar2 == SampleCmpLevel) goto LAB_0015ebb5;
    }
  }
  else {
    if (((Op)local_100 & ~TempRegStore) == Sample) {
      OVar7 = SampleLevel;
      uVar21 = (int)CONCAT71((int7)((ulong)num_dimensions >> 8),1);
    }
    else {
      OVar7 = SampleCmpLevelZero;
      num_dimensions = (uint32_t *)0x0;
      local_d0 = 0;
      uVar21 = 0;
      if ((Op)local_100 != SampleCmp) {
        bVar4 = false;
        bVar27 = false;
        cVar3 = '\0';
        if ((Op)local_100 != SampleCmpBias) goto LAB_0015eadc;
        goto LAB_0015ebb5;
      }
    }
    local_d0 = uVar21;
    bVar4 = false;
    bVar27 = false;
LAB_0015ebb5:
    image_ops = 2;
    local_100._4_4_ = 0;
    local_100._0_4_ = OVar7;
  }
  offsets[2] = 0;
  offsets[0] = 0;
  offsets[1] = 0;
  local_c4 = num_coords;
  get_texel_offsets(impl,instruction,&image_ops,7,num_coords,offsets,(bool)in_stack_fffffffffffffee8
                   );
  local_ac = 0;
  uVar20 = 10;
  if ((char)local_ec != '\0') {
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,10);
    local_ac = Converter::Impl::get_id_for_value(impl,pVVar11,0);
    uVar20 = 0xb;
  }
  index = bVar27 + 0xb;
  if (bVar4) {
    index = 10;
  }
  local_48._M_array = (iterator)instruction;
  pmVar13 = std::__detail::
            _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->llvm_composite_meta,(key_type *)&local_48);
  uVar1 = pmVar13->access_mask;
  if ((uVar1 & 0x10) != 0) {
    spv::Builder::addCapability(local_d8,CapabilitySparseResidency);
  }
  local_c8 = 0;
  uVar23 = (Op)local_100 - Sample;
  if (((uVar23 < 5) && ((0x13U >> (uVar23 & 0x1f) & 1) != 0)) || ((Op)local_100 == SampleCmpBias)) {
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
    bVar4 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar11);
    if (!bVar4) {
      pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
      local_c8 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
      image_ops = image_ops | 0x80;
      spv::Builder::addCapability(local_d8,CapabilityMinLod);
    }
  }
  if ((cVar22 == '\0') &&
     ((((Op)local_100 - SampleBias < 2 || ((Op)local_100 == SampleCmpBias)) ||
      ((Op)local_100 == SampleCmpLevel)))) {
    pVVar11 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar20);
    local_f4 = Converter::Impl::get_id_for_value(impl,pVVar11,0);
  }
  else {
    local_f4 = spv::Builder::makeFloatConstant(local_d8,0.0,false);
  }
  IVar5 = image_id;
  if ((cVar22 == '\0') &&
     (((byte)local_d0 & (impl->options).quirks.assume_broken_sub_8x8_cube_mips) != 0)) {
    pBVar14 = Converter::Impl::builder(impl);
    IVar6 = Converter::Impl::get_type_id(impl,IVar5);
    DVar8 = spv::Builder::getTypeDimensionality(pBVar14,IVar6);
    if (DVar8 == DimCube) {
      IVar6 = spv::Builder::makeIntType(pBVar14,0x20);
      pOVar15 = Converter::Impl::allocate(impl,OpImageQueryLevels,IVar6);
      Operation::add_id(pOVar15,IVar5);
      Converter::Impl::add(impl,pOVar15,false);
      IVar5 = spv::Builder::makeIntType(pBVar14,0x20);
      pOVar16 = Converter::Impl::allocate(impl,OpISub,IVar5);
      Operation::add_id(pOVar16,pOVar15->id);
      IVar5 = spv::Builder::makeUintConstant(pBVar14,4,false);
      Operation::add_id(pOVar16,IVar5);
      Converter::Impl::add(impl,pOVar16,false);
      IVar5 = spv::Builder::makeFloatType(pBVar14,0x20);
      pOVar15 = Converter::Impl::allocate(impl,OpConvertSToF,IVar5);
      Operation::add_id(pOVar15,pOVar16->id);
      Converter::Impl::add(impl,pOVar15,false);
      if (impl->glsl_std450_ext == 0) {
        IVar5 = spv::Builder::import(pBVar14,"GLSL.std.450");
        impl->glsl_std450_ext = IVar5;
      }
      IVar5 = spv::Builder::makeFloatType(pBVar14,0x20);
      pOVar16 = Converter::Impl::allocate(impl,OpExtInst,IVar5);
      Operation::add_id(pOVar16,impl->glsl_std450_ext);
      Operation::add_literal(pOVar16,0x25);
      Operation::add_id(pOVar16,pOVar15->id);
      Operation::add_id(pOVar16,local_f4);
      Converter::Impl::add(impl,pOVar16,false);
      local_f4 = pOVar16->id;
    }
    else {
switchD_0015eee2_caseD_2:
    }
    op = OpImageSparseSampleExplicitLod;
    if ((uVar1 & 0x10) == 0) {
      op = OpImageSampleExplicitLod;
    }
  }
  else {
    bVar4 = false;
    switch(uVar23) {
    case 0:
    case 1:
      bVar4 = (uVar1 & 0x10) == 0;
      OVar9 = OpImageSampleImplicitLod;
      op = OpImageSparseSampleImplicitLod;
      break;
    case 2:
      goto switchD_0015eee2_caseD_2;
    case 3:
      goto switchD_0015eee2_caseD_3;
    case 5:
switchD_0015eee2_caseD_5:
      bVar4 = (uVar1 & 0x10) == 0;
      op = OpImageSparseSampleDrefExplicitLod;
      OVar9 = OpImageSampleDrefExplicitLod;
      break;
    default:
      if ((Op)local_100 == SampleCmpLevel) goto switchD_0015eee2_caseD_5;
      if ((Op)local_100 != SampleCmpBias) {
        return false;
      }
    case 4:
      bVar4 = (uVar1 & 0x10) == 0;
      OVar9 = OpImageSampleDrefImplicitLod;
      op = OpImageSparseSampleDrefImplicitLod;
    }
    if (bVar4) {
      op = OVar9;
    }
  }
  uVar21 = local_ec;
  element_type = Converter::Impl::get_effective_typed_resource_type(local_e8->component_type);
  bVar19 = (byte)uVar21 ^ 1;
  local_d0 = (uint)bVar19 + (uint)bVar19 * 2 + 1;
  local_100._0_4_ = 0;
  IVar5 = Converter::Impl::get_type_id(impl,element_type,1,local_d0,false);
  if ((uVar1 & 0x10) != 0) {
    local_68 = spv::Builder::makeUintType(local_d8,0x20);
    local_48._M_array = (iterator)0x0;
    local_48._M_len = 0;
    local_38 = 0;
    IStack_64 = IVar5;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
               &local_68);
    IVar5 = Converter::Impl::get_struct_type(impl,(Vector<spv::Id> *)&local_48,0,"SparseTexel");
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_48);
  }
  if ((impl->execution_model == ExecutionModelFragment) ||
     (((impl->options).compute_shader_derivatives & 1U) != 0)) {
    IVar6 = 0;
  }
  else {
    if (op == OpImageSampleImplicitLod) {
      local_dc = OpImageSampleExplicitLod;
    }
    else if (op == OpImageSampleDrefImplicitLod) {
      local_dc = OpImageSampleDrefExplicitLod;
    }
    else if (op == OpImageSparseSampleDrefImplicitLod) {
      local_dc = OpImageSparseSampleDrefExplicitLod;
    }
    else {
      IVar6 = 0;
      if (op != OpImageSparseSampleImplicitLod) goto LAB_0015f352;
      local_dc = OpImageSparseSampleExplicitLod;
    }
    local_f0 = IVar5;
    pBVar14 = Converter::Impl::builder(impl);
    local_b0 = spv::Builder::makeFloatType(pBVar14,0x20);
    uVar20 = local_c4;
    IVar5 = spv::Builder::makeVectorType(pBVar14,local_b0,local_c4);
    local_b8 = (Operation *)CONCAT44(local_b8._4_4_,IVar5);
    IVar6 = spv::Builder::makeFloatType(pBVar14,0x20);
    IVar6 = Converter::Impl::build_vector(impl,IVar6,coord,uVar20);
    spv::Builder::addCapability(pBVar14,CapabilityGroupNonUniformQuad);
    pOVar15 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar5);
    IVar5 = spv::Builder::makeUintConstant(pBVar14,3,false);
    Operation::add_id(pOVar15,IVar5);
    local_100 = pOVar15;
    Operation::add_id(pOVar15,IVar6);
    IVar5 = spv::Builder::makeUintConstant(pBVar14,0,false);
    Operation::add_id(pOVar15,IVar5);
    IVar5 = (Id)local_b8;
    pOVar15 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,(Id)local_b8);
    IVar10 = spv::Builder::makeUintConstant(pBVar14,3,false);
    Operation::add_id(pOVar15,IVar10);
    local_c0 = pOVar15;
    Operation::add_id(pOVar15,IVar6);
    IVar10 = spv::Builder::makeUintConstant(pBVar14,1,false);
    Operation::add_id(pOVar15,IVar10);
    pOVar16 = Converter::Impl::allocate(impl,OpFSub,IVar5);
    pOVar17 = Converter::Impl::allocate(impl,OpFSub,IVar5);
    Operation::add_id(pOVar16,IVar6);
    Operation::add_id(pOVar16,local_100->id);
    Operation::add_id(pOVar17,IVar6);
    pOVar15 = local_c0;
    Operation::add_id(pOVar17,local_c0->id);
    Converter::Impl::add(impl,local_100,false);
    Converter::Impl::add(impl,pOVar15,false);
    Converter::Impl::add(impl,pOVar16,false);
    Converter::Impl::add(impl,pOVar17,false);
    IVar6 = pOVar16->id;
    IVar5 = pOVar17->id;
    uVar24 = image_ops;
    local_100._0_4_ = IVar5;
    if ((image_ops & 1) != 0) {
      uVar24 = image_ops & 0xfffffffe;
      image_ops = uVar24;
      if (impl->glsl_std450_ext == 0) {
        IVar5 = spv::Builder::import(pBVar14,"GLSL.std.450");
        impl->glsl_std450_ext = IVar5;
      }
      pOVar17 = Converter::Impl::allocate(impl,OpExtInst,local_b0);
      Operation::add_id(pOVar17,impl->glsl_std450_ext);
      Operation::add_literal(pOVar17,0x1d);
      Operation::add_id(pOVar17,local_f4);
      Converter::Impl::add(impl,pOVar17,false);
      IVar5 = (Id)local_b8;
      local_c0 = Converter::Impl::allocate(impl,OpVectorTimesScalar,(Id)local_b8);
      local_b8 = Converter::Impl::allocate(impl,OpVectorTimesScalar,IVar5);
      pOVar15 = local_c0;
      Operation::add_id(local_c0,IVar6);
      Operation::add_id(pOVar15,pOVar17->id);
      pOVar16 = local_b8;
      Operation::add_id(local_b8,(Op)local_100);
      Operation::add_id(pOVar16,pOVar17->id);
      pOVar15 = local_c0;
      Converter::Impl::add(impl,local_c0,false);
      Converter::Impl::add(impl,pOVar16,false);
      IVar6 = pOVar15->id;
      local_100._0_4_ = pOVar16->id;
    }
    image_ops = uVar24 | 4;
    IVar5 = local_f0;
    op = local_dc;
  }
LAB_0015f352:
  pOVar15 = Converter::Impl::allocate(impl,op,(Value *)instruction,IVar5);
  if ((uVar1 & 0x10) == 0) {
    pTVar18 = LLVMBC::Value::getType((Value *)instruction);
    pTVar18 = LLVMBC::Type::getStructElementType(pTVar18,0);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar18,pOVar15->id,true);
  }
  Operation::add_id(pOVar15,local_a8);
  IVar5 = spv::Builder::makeFloatType(local_d8,0x20);
  IVar5 = Converter::Impl::build_vector(impl,IVar5,coord,count);
  Operation::add_id(pOVar15,IVar5);
  if (local_ac != 0) {
    Operation::add_id(pOVar15,local_ac);
  }
  uVar24 = image_ops;
  Operation::add_literal(pOVar15,image_ops);
  if ((uVar24 & 3) != 0) {
    Operation::add_id(pOVar15,local_f4);
  }
  if ((uVar24 & 4) != 0) {
    Operation::add_id(pOVar15,IVar6);
    Operation::add_id(pOVar15,(Op)local_100);
  }
  if ((uVar24 & 0x18) != 0) {
    IVar5 = build_texel_offset_vector(impl,offsets,local_c4,uVar24,false);
    Operation::add_id(pOVar15,IVar5);
  }
  if ((char)uVar24 < '\0') {
    Operation::add_id(pOVar15,local_c8);
  }
  Converter::Impl::add(impl,pOVar15,false);
  pTVar18 = LLVMBC::Value::getType((Value *)instruction);
  pTVar18 = LLVMBC::Type::getStructElementType(pTVar18,0);
  if ((uVar1 & 0x10) == 0) {
    if ((char)local_ec == '\0') {
      Converter::Impl::fixup_load_type_typed
                (impl,local_e8->component_type,4,(Value *)instruction,pTVar18);
    }
    else {
      loaded_id = pOVar15->id;
      tmp = local_e8->component_type;
      Converter::Impl::fixup_load_type_typed(impl,&tmp,1,&loaded_id,pTVar18);
      IVar5 = Converter::Impl::get_type_id(impl,pTVar18,0);
      IVar5 = spv::Builder::makeVectorType(local_d8,IVar5,4);
      pOVar15 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar5);
      local_68 = loaded_id;
      IStack_64 = loaded_id;
      IStack_60 = loaded_id;
      IStack_5c = loaded_id;
      local_48._M_len = 4;
      local_48._M_array = &local_68;
      Operation::add_ids(pOVar15,&local_48);
      Converter::Impl::add(impl,pOVar15,false);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar15->id);
    }
  }
  else {
    Converter::Impl::repack_sparse_feedback
              (impl,local_e8->component_type,local_d0,(Value *)instruction,pTVar18,0);
  }
  build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
  bVar4 = true;
switchD_0015eee2_caseD_3:
  return bVar4;
}

Assistant:

bool emit_sample_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	bool comparison_sampling = opcode == DXIL::Op::SampleCmp ||
	                           opcode == DXIL::Op::SampleCmpLevelZero ||
	                           opcode == DXIL::Op::SampleCmpLevel ||
	                           opcode == DXIL::Op::SampleCmpBias;

	bool force_explicit_lod = impl.execution_mode_meta.synthesize_dummy_derivatives;

	// Elide dead loads.
	if (!comparison_sampling && !impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, comparison_sampling);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	spv::Id coord[4] = {};
	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	uint32_t image_ops = 0;

	if (force_explicit_lod)
	{
		if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleBias)
			opcode = DXIL::Op::SampleLevel;
		else if (opcode == DXIL::Op::SampleCmp || opcode == DXIL::Op::SampleCmpBias)
			opcode = DXIL::Op::SampleCmpLevelZero;
		else
			force_explicit_lod = false;
	}

	if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleBias ||
	    opcode == DXIL::Op::SampleCmpBias || opcode == DXIL::Op::SampleCmp)
	{
		emit_expect_assume_quad_uniform(impl);
	}

	if (opcode == DXIL::Op::SampleLevel || opcode == DXIL::Op::SampleCmpLevelZero || opcode == DXIL::Op::SampleCmpLevel)
		image_ops |= spv::ImageOperandsLodMask;
	else if (opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias)
		image_ops |= spv::ImageOperandsBiasMask;

	spv::Id offsets[3] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 7, num_coords, offsets, false))
		return false;

	spv::Id dref_id = 0;

	if (comparison_sampling)
		dref_id = impl.get_id_for_value(instruction->getOperand(10));

	spv::Id bias_level_argument = 0;
	spv::Id min_lod_argument = 0;
	unsigned bias_level_argument_index = comparison_sampling ? 11 : 10;
	unsigned min_lod_argument_index = 11;

	if (opcode == DXIL::Op::Sample)
		min_lod_argument_index = 10;
	else if (opcode == DXIL::Op::SampleCmpBias)
		min_lod_argument_index = 12;

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleCmp || opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias)
	{
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(min_lod_argument_index)))
		{
			min_lod_argument = impl.get_id_for_value(instruction->getOperand(min_lod_argument_index));
			image_ops |= spv::ImageOperandsMinLodMask;
			builder.addCapability(spv::CapabilityMinLod);
		}
	}

	if (force_explicit_lod)
		bias_level_argument = builder.makeFloatConstant(0.0f);
	else if (opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias || opcode == DXIL::Op::SampleLevel || opcode == DXIL::Op::SampleCmpLevel)
		bias_level_argument = impl.get_id_for_value(instruction->getOperand(bias_level_argument_index));
	else
		bias_level_argument = builder.makeFloatConstant(0.0f);

	if (!force_explicit_lod && impl.options.quirks.assume_broken_sub_8x8_cube_mips && opcode == DXIL::Op::SampleLevel)
		bias_level_argument = emit_workaround_clamp_cube_mips(impl, image_id, bias_level_argument);

	spv::Op spv_op;

	switch (opcode)
	{
	case DXIL::Op::SampleLevel:
		spv_op = sparse ? spv::OpImageSparseSampleExplicitLod : spv::OpImageSampleExplicitLod;
		break;

	case DXIL::Op::Sample:
	case DXIL::Op::SampleBias:
		spv_op = sparse ? spv::OpImageSparseSampleImplicitLod : spv::OpImageSampleImplicitLod;
		break;

	case DXIL::Op::SampleCmp:
	case DXIL::Op::SampleCmpBias:
		spv_op = sparse ? spv::OpImageSparseSampleDrefImplicitLod : spv::OpImageSampleDrefImplicitLod;
		break;

	case DXIL::Op::SampleCmpLevel:
	case DXIL::Op::SampleCmpLevelZero:
		spv_op = sparse ? spv::OpImageSparseSampleDrefExplicitLod : spv::OpImageSampleDrefExplicitLod;
		break;

	default:
		return false;
	}

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, comparison_sampling ? 1 : 4);
	spv::Id grad_x = 0, grad_y = 0;
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	bool grad_rewrite = impl.execution_model != spv::ExecutionModelFragment &&
	                    !impl.options.compute_shader_derivatives;

	if (grad_rewrite)
	{
		switch (spv_op)
		{
		case spv::OpImageSampleImplicitLod:
			spv_op = spv::OpImageSampleExplicitLod;
			break;

		case spv::OpImageSparseSampleImplicitLod:
			spv_op = spv::OpImageSparseSampleExplicitLod;
			break;

		case spv::OpImageSampleDrefImplicitLod:
			spv_op = spv::OpImageSampleDrefExplicitLod;
			break;

		case spv::OpImageSparseSampleDrefImplicitLod:
			spv_op = spv::OpImageSparseSampleDrefExplicitLod;
			break;

		default:
			grad_rewrite = false;
			break;
		}
	}

	if (grad_rewrite)
		build_gradient(impl, coord, num_coords, grad_x, grad_y, bias_level_argument, image_ops);

	// Comparison sampling only returns a scalar, so we'll need to splat out result.
	Operation *op = impl.allocate(spv_op, instruction, sample_type);

	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_id(combined_image_sampler_id);
	op->add_id(impl.build_vector(builder.makeFloatType(32), coord, num_coords_full));

	if (dref_id)
		op->add_id(dref_id);

	op->add_literal(image_ops);

	if (image_ops & (spv::ImageOperandsBiasMask | spv::ImageOperandsLodMask))
		op->add_id(bias_level_argument);

	if (image_ops & spv::ImageOperandsGradMask)
	{
		op->add_id(grad_x);
		op->add_id(grad_y);
	}

	if (image_ops & (spv::ImageOperandsConstOffsetMask | spv::ImageOperandsOffsetMask))
	{
		spv::Id offset_vec = build_texel_offset_vector(impl, offsets, num_coords, image_ops, false);
		op->add_id(offset_vec);
	}

	if (image_ops & spv::ImageOperandsMinLodMask)
		op->add_id(min_lod_argument);

	impl.add(op);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
	{
		// Repack return arguments from { i32, Tx4 } into { T, T, T, T, i32 } which DXIL expects.
		impl.repack_sparse_feedback(meta.component_type, comparison_sampling ? 1 : 4, instruction, target_type);
	}
	else if (comparison_sampling)
	{
		spv::Id loaded_id = op->id;
		auto tmp = meta.component_type;
		impl.fixup_load_type_typed(tmp, 1, loaded_id, target_type);
		Operation *splat_op =
			impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(impl.get_type_id(target_type), 4));
		splat_op->add_ids({ loaded_id, loaded_id, loaded_id, loaded_id });
		impl.add(splat_op);
		impl.rewrite_value(instruction, splat_op->id);
	}
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
	}

	build_exploded_composite_from_vector(impl, instruction, 4);

	return true;
}